

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::BinaryOp::BinaryOp(BinaryOp *this,Token *t,int p,int a,int line)

{
  Token TStack_58;
  
  token::Token::Token(&TStack_58,t);
  Op::Op(&this->super_Op,&TStack_58,p,a,line,BinaryOpType);
  token::Token::~Token(&TStack_58);
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR__BinaryOp_00122908;
  this->RightOp = (Expr *)0x0;
  this->LeftOp = (Expr *)0x0;
  return;
}

Assistant:

BinaryOp(Token t, int p, int a, int line)
        :Op(t, p, a, line, NodeType::BinaryOpType), RightOp{nullptr}, LeftOp{nullptr} {}